

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_sound_srcs.cxx
# Opt level: O3

void __thiscall xray_re::xr_sound_src_object::save(xr_sound_src_object *this,xr_writer *w)

{
  float local_1c;
  
  xr_custom_object::save(&this->super_xr_custom_object,w);
  xr_writer::w_raw_chunk(w,0x1001,&SOUNDSRC_VERSION,2,false);
  xr_writer::w_raw_chunk(w,0x1002,&this->m_type,1,false);
  xr_writer::open_chunk(w,0x1003);
  xr_writer::w_sz(w,&this->m_source_name);
  xr_writer::close_chunk(w);
  xr_writer::w_raw_chunk(w,0x1005,&(this->super_xr_custom_object).field_0x6c,4,false);
  xr_writer::open_chunk(w,0x1007);
  local_1c = (this->m_sound_pos).field_0.field_0.x;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (this->m_sound_pos).field_0.field_0.y;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (this->m_sound_pos).field_0.field_0.z;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = this->m_volume;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = this->m_frequency;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = this->m_min_dist;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = this->m_max_dist;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = this->m_max_ai_dist;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,0x1008);
  local_1c = (this->m_pause_time).field_0.field_0.x;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (this->m_pause_time).field_0.field_0.y;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (this->m_active_time).field_0.field_0.x;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (this->m_active_time).field_0.field_0.y;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (this->m_play_time).field_0.field_0.x;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (this->m_play_time).field_0.field_0.y;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  xr_writer::close_chunk(w);
  return;
}

Assistant:

void xr_sound_src_object::save(xr_writer& w) const
{
	xr_custom_object::save(w);
	w.w_chunk<uint16_t>(SOUNDSRC_CHUNK_VERSION, SOUNDSRC_VERSION);
	w.w_chunk<uint8_t>(SOUNDSRC_CHUNK_TYPE, m_type);

	w.w_chunk(SOUNDSRC_CHUNK_SOURCE_NAME, m_source_name);

	w.w_chunk<uint32_t>(SOUNDSRC_CHUNK_FLAGS, m_flags);

	w.open_chunk(SOUNDSRC_CHUNK_PARAMS_2);
	w.w_fvector3(m_sound_pos);
	w.w_float(m_volume);
	w.w_float(m_frequency);
	w.w_float(m_min_dist);
	w.w_float(m_max_dist);
	w.w_float(m_max_ai_dist);
	w.close_chunk();

	w.open_chunk(SOUNDSRC_CHUNK_TIME);
	w.w_fvector2(m_pause_time);
	w.w_fvector2(m_active_time);
	w.w_fvector2(m_play_time);
	w.close_chunk();
}